

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall Token::Token(Token *this,string *_content)

{
  bool bVar1;
  runtime_error *this_00;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  string_view local_38;
  string_view local_28;
  string *local_18;
  string *_content_local;
  Token *this_local;
  
  local_18 = _content;
  _content_local = &this->content;
  std::__cxx11::string::string((string *)this,(string *)_content);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"%3A");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,":");
  ::str::replace_all(&this->content,local_28,local_38);
  local_58 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"std::");
  bVar1 = ::str::starts_with(local_58,local_68);
  if (bVar1) {
    stripToken(this);
    this->type = std;
  }
  else {
    local_78 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"<");
    bVar1 = ::str::starts_with(local_78,local_88);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unknown token");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->type = header;
  }
  return;
}

Assistant:

Token(std::string _content) :
            content(std::move(_content)) {
        str::replace_all(content, "%3A", ":");

        if (str::starts_with(content, "std::")) {
            stripToken();
            type = Type::std;
        } else if (str::starts_with(content, "<")) {
            type = Type::header;
        } else {
            throw std::runtime_error("unknown token");
        }
    }